

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SeparationPart.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::SeparationPart::Encode(SeparationPart *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  SeparationPart *this_local;
  
  pKVar1 = KDataStream::operator<<(stream,(this->super_VariableParameter).m_ui8VarParamType);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui8Reason);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui8PreEntIndicator);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui8Padding);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,(DataTypeBase *)&this->m_ParentEntId);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui16Padding);
  DATA_TYPE::operator<<(pKVar1,&(this->m_StationLoc).super_DataTypeBase);
  return;
}

Assistant:

void SeparationPart::Encode( KDataStream & stream ) const
{
    stream << m_ui8VarParamType
           << m_ui8Reason
           << m_ui8PreEntIndicator
           << m_ui8Padding
           << KDIS_STREAM m_ParentEntId
           << m_ui16Padding
           << KDIS_STREAM m_StationLoc;
}